

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

void bench_sign_setup(void *arg)

{
  long lVar1;
  
  lVar1 = 0;
  while (lVar1 != 0x20) {
    *(char *)((long)arg + lVar1 + 8) = (char)(lVar1 + 1);
    lVar1 = lVar1 + 1;
  }
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    *(char *)((long)arg + lVar1 + 0x28) = (char)lVar1 + 'A';
  }
  return;
}

Assistant:

static void bench_sign_setup(void* arg) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < 32; i++) {
        data->msg[i] = i + 1;
    }
    for (i = 0; i < 32; i++) {
        data->key[i] = i + 65;
    }
}